

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  int iVar1;
  uint uVar2;
  char *__s;
  PointerType pSVar3;
  PointerType pBVar4;
  utsname uts_name;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  utsname local_190;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"UNIX",(allocator<char> *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"1",&local_1d2);
  SetDefinition(this,(string *)&local_190,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CMAKE_HOST_UNIX",(allocator<char> *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"1",&local_1d2);
  SetDefinition(this,(string *)&local_190,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_190);
  iVar1 = uname(&local_190);
  if (-1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"CMAKE_HOST_SYSTEM_NAME",&local_1d2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,local_190.sysname,&local_1d1);
    SetDefinition(this,&local_1d0,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_MAJOR_VERSION",&local_1d2);
  uVar2 = cmVersion::GetMajorVersion();
  std::__cxx11::to_string(&local_1b0,uVar2);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_MINOR_VERSION",&local_1d2);
  uVar2 = cmVersion::GetMinorVersion();
  std::__cxx11::to_string(&local_1b0,uVar2);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_PATCH_VERSION",&local_1d2);
  uVar2 = cmVersion::GetPatchVersion();
  std::__cxx11::to_string(&local_1b0,uVar2);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_TWEAK_VERSION",&local_1d2);
  uVar2 = cmVersion::GetTweakVersion();
  std::__cxx11::to_string(&local_1b0,uVar2);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_VERSION",&local_1d2);
  __s = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,__s,&local_1d1);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CMAKE_FILES_DIRECTORY",&local_1d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"/CMakeFiles",&local_1d1);
  SetDefinition(this,&local_1d0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"INCLUDE_REGULAR_EXPRESSION",(allocator<char> *)&local_1b0);
  cmPropertyMap::SetProperty(&pBVar4->Properties,&local_1d0,"^.*$");
  std::__cxx11::string::~string((string *)&local_1d0);
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
/* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
  With CMake must separate between target and host platform. In most cases
  the tests for WIN32, UNIX and APPLE will be for the target system, so an
  additional set of variables for the host system is required ->
  CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
  WIN32, UNIX and APPLE are now set in the platform files in
  Modules/Platforms/.
  To keep cmake scripts (-P) and custom language and compiler modules
  working, these variables are still also set here in this place, but they
  will be reset in CMakeSystemSpecificInformation.cmake before the platform
  files are executed. */
#if defined(_WIN32)
  this->SetDefinition("WIN32", "1");
  this->SetDefinition("CMAKE_HOST_WIN32", "1");
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", "Windows");
#else
  this->SetDefinition("UNIX", "1");
  this->SetDefinition("CMAKE_HOST_UNIX", "1");

  struct utsname uts_name;
  if (uname(&uts_name) >= 0) {
    this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", uts_name.sysname);
  }
#endif
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmSystemTools::IsOn(legacy.c_str())) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}